

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::removeOrder(PatternModel *this)

{
  OrderRemoveCmd *this_00;
  QUndoStack *pQVar1;
  QArrayData *local_48 [3];
  QArrayData *local_30 [3];
  
  this_00 = (OrderRemoveCmd *)operator_new(0x20);
  OrderRemoveCmd::OrderRemoveCmd(this_00,this,this->mCursorPattern);
  QMetaObject::tr((char *)local_30,(char *)&staticMetaObject,0x1b6007);
  QString::arg((longlong)local_48,(int)local_30,this->mCursorPattern,(QChar)0x0);
  QUndoCommand::setText((QString *)this_00);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,8);
    }
  }
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar1 = Module::undoStack(this->mModule);
  QUndoStack::push((QUndoCommand *)pQVar1);
  return;
}

Assistant:

void PatternModel::removeOrder() {
    auto cmd = new OrderRemoveCmd(*this, mCursorPattern);
    cmd->setText(tr("remove order #%1").arg(mCursorPattern));
    mModule.undoStack()->push(cmd);
}